

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void do_gpr_ld_memidx(DisasContext_conflict1 *s,TCGv_i64 dest,TCGv_i64 tcg_addr,int size,
                     _Bool is_signed,_Bool extend,int memidx,_Bool iss_valid,uint iss_srt,
                     _Bool iss_sf,_Bool iss_ar)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint32_t syn_00;
  MemOp local_44;
  uint32_t syn;
  MemOp memop;
  TCGContext_conflict1 *tcg_ctx;
  _Bool iss_ar_local;
  _Bool iss_sf_local;
  _Bool iss_valid_local;
  _Bool extend_local;
  _Bool is_signed_local;
  int size_local;
  TCGv_i64 tcg_addr_local;
  TCGv_i64 dest_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  local_44 = s->be_data + size;
  if (3 < size) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
               ,0x387,"size <= 3");
  }
  if (is_signed) {
    local_44 = local_44 + MO_ASHIFT;
  }
  tcg_gen_qemu_ld_i64_aarch64(tcg_ctx_00,dest,tcg_addr,(long)memidx,local_44);
  if ((extend) && (is_signed)) {
    if (2 < size) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x390,"size < 3");
    }
    tcg_gen_ext32u_i64_aarch64(tcg_ctx_00,dest,dest);
  }
  if (iss_valid) {
    syn_00 = syn_data_abort_with_iss
                       (0,size,(uint)is_signed,iss_srt,(uint)iss_sf,(uint)iss_ar,0,0,0,0,0,false);
    disas_set_insn_syndrome(s,syn_00);
  }
  return;
}

Assistant:

static void do_gpr_ld_memidx(DisasContext *s,
                             TCGv_i64 dest, TCGv_i64 tcg_addr,
                             int size, bool is_signed,
                             bool extend, int memidx,
                             bool iss_valid, unsigned int iss_srt,
                             bool iss_sf, bool iss_ar)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    MemOp memop = s->be_data + size;

    g_assert(size <= 3);

    if (is_signed) {
        memop += MO_SIGN;
    }

    tcg_gen_qemu_ld_i64(tcg_ctx, dest, tcg_addr, memidx, memop);

    if (extend && is_signed) {
        g_assert(size < 3);
        tcg_gen_ext32u_i64(tcg_ctx, dest, dest);
    }

    if (iss_valid) {
        uint32_t syn;

        syn = syn_data_abort_with_iss(0,
                                      size,
                                      is_signed,
                                      iss_srt,
                                      iss_sf,
                                      iss_ar,
                                      0, 0, 0, 0, 0, false);
        disas_set_insn_syndrome(s, syn);
    }
}